

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int ipv4_from_asc(uint8_t *v4,char *in)

{
  int iVar1;
  uint uVar2;
  char *local_18;
  uint uVar3;
  
  local_18 = in;
  iVar1 = get_ipv4_component(v4,&local_18);
  uVar2 = 0;
  uVar3 = 0;
  if ((iVar1 != 0) && (*local_18 == '.')) {
    local_18 = local_18 + 1;
    iVar1 = get_ipv4_component(v4 + 1,&local_18);
    if ((iVar1 != 0) && (uVar2 = uVar3, *local_18 == '.')) {
      local_18 = local_18 + 1;
      iVar1 = get_ipv4_component(v4 + 2,&local_18);
      if ((iVar1 != 0) && (*local_18 == '.')) {
        local_18 = local_18 + 1;
        iVar1 = get_ipv4_component(v4 + 3,&local_18);
        if (iVar1 != 0) {
          uVar2 = (uint)(*local_18 == '\0');
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int ipv4_from_asc(uint8_t v4[4], const char *in) {
  if (!get_ipv4_component(&v4[0], &in) || !get_ipv4_dot(&in) ||
      !get_ipv4_component(&v4[1], &in) || !get_ipv4_dot(&in) ||
      !get_ipv4_component(&v4[2], &in) || !get_ipv4_dot(&in) ||
      !get_ipv4_component(&v4[3], &in) || *in != '\0') {
    return 0;
  }
  return 1;
}